

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportCommand.cxx
# Opt level: O3

bool cmExportCommand(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *args,cmExecutionStatus *status)

{
  pointer pbVar1;
  char *__s;
  cmMakefile *pcVar2;
  pointer pcVar3;
  undefined8 uVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  TargetType TVar8;
  PolicyStatus PVar9;
  undefined8 *puVar10;
  ostream *poVar11;
  string *psVar12;
  cmGlobalGenerator *this;
  cmTarget *this_00;
  cmExportBuildFileGenerator *pcVar13;
  iterator iVar14;
  size_t sVar15;
  PolicyID id;
  string *ct;
  undefined8 config;
  pointer ppVar16;
  undefined8 uVar17;
  cmExportSet *exportSet;
  static_string_view name;
  static_string_view name_00;
  static_string_view name_01;
  string_view name_02;
  static_string_view name_03;
  static_string_view name_04;
  static_string_view name_05;
  static_string_view name_06;
  string fname_1;
  string fname;
  string package;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  targets;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configurationTypes;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unknownArgs;
  Arguments arguments;
  cmArgumentParser<Arguments> parser;
  undefined1 auStack_5e8 [8];
  undefined1 local_5e0 [16];
  undefined1 local_5d0 [32];
  string local_5b0;
  undefined1 local_590 [16];
  undefined1 local_580 [40];
  undefined1 local_558 [24];
  undefined1 auStack_540 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_528;
  undefined1 local_518 [16];
  undefined1 local_508 [24];
  _Alloc_hider _Stack_4f0;
  undefined1 local_4e8 [24];
  undefined1 auStack_4d0 [16];
  undefined1 auStack_4c0 [512];
  size_type local_2c0;
  undefined1 local_2b8 [32];
  undefined1 local_298 [8];
  _Invoker_type local_290;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_288;
  _Storage<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_false>
  local_278;
  bool local_260;
  _Alloc_hider local_258;
  size_type local_250;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_248;
  undefined1 local_238 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_228;
  _Alloc_hider local_218;
  size_type local_210;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_208;
  _Alloc_hider local_1f8;
  size_type local_1f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e8;
  undefined2 local_1d8;
  long *local_120 [2];
  long local_110 [2];
  undefined1 local_100 [56];
  undefined1 local_c8 [16];
  _Alloc_hider local_b8;
  vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
  local_a8 [3];
  char *local_50;
  undefined8 local_40;
  int local_38;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1) < 0x21) {
    local_528._M_allocated_capacity = (size_type)local_518;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_528,"called with too few arguments","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    if ((undefined1 *)local_528._M_allocated_capacity != local_518) {
      operator_delete((void *)local_528._M_allocated_capacity,(ulong)(local_518._0_8_ + 1));
    }
    return false;
  }
  iVar7 = std::__cxx11::string::compare((char *)pbVar1);
  if (iVar7 != 0) {
    auStack_4d0._8_8_ = (pointer)0x0;
    auStack_4c0._0_8_ = (pointer)0x0;
    local_4e8._16_8_ = (pointer)0x0;
    auStack_4d0._0_8_ = (pointer)0x0;
    local_4e8._0_8_ = (_Base_ptr)0x0;
    local_4e8._8_8_ = (_Base_ptr)0x0;
    local_508._16_8_ = 0;
    _Stack_4f0._M_p = (pointer)0x0;
    local_508._0_8_ = 0;
    local_508._8_8_ = (code *)0x0;
    local_518._0_8_ = (_func_int **)0x0;
    local_518._8_8_ = (pointer)0x0;
    local_528._M_allocated_capacity = 0;
    local_528._8_8_ = 0;
    name.super_string_view._M_str = "NAMESPACE";
    name.super_string_view._M_len = 9;
    cmArgumentParser<cmExportCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
    ::Bind<std::__cxx11::string>
              ((cmArgumentParser<cmExportCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                *)local_528._M_local_buf,name,0x40);
    name_00.super_string_view._M_str = "FILE";
    name_00.super_string_view._M_len = 4;
    cmArgumentParser<cmExportCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
    ::Bind<std::__cxx11::string>
              ((cmArgumentParser<cmExportCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                *)local_528._M_local_buf,name_00,0x60);
    ArgumentParser::ActionMap::ActionMap((ActionMap *)local_100,(ActionMap *)&local_528);
    std::
    vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
    ::~vector((vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
               *)auStack_4d0);
    if ((_Base_ptr)local_4e8._8_8_ != (_Base_ptr)0x0) {
      (*(code *)local_4e8._8_8_)(&_Stack_4f0,&_Stack_4f0,3);
    }
    if ((code *)local_508._8_8_ != (code *)0x0) {
      (*(code *)local_508._8_8_)(local_518 + 8,local_518 + 8,3);
    }
    std::
    vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
    ::~vector((vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
               *)&local_528);
    bVar5 = cmExperimental::HasSupportEnabled(status->Makefile,CxxModuleCMakeApi);
    if (bVar5) {
      name_01.super_string_view._M_str = "CXX_MODULES_DIRECTORY";
      name_01.super_string_view._M_len = 0x15;
      cmArgumentParser<cmExportCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
      ::Bind<std::__cxx11::string>
                ((cmArgumentParser<cmExportCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                  *)local_100,name_01,0xa0);
    }
    iVar7 = std::__cxx11::string::compare
                      ((char *)(args->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start);
    if (iVar7 == 0) {
      name_06.super_string_view._M_str = "EXPORT";
      name_06.super_string_view._M_len = 6;
      cmArgumentParser<cmExportCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
      ::Bind<std::__cxx11::string>
                ((cmArgumentParser<cmExportCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                  *)local_100,name_06,0);
    }
    else {
      local_528._8_8_ = 0;
      local_528._M_allocated_capacity = 0x20;
      local_518._8_8_ =
           std::
           _Function_handler<void_(ArgumentParser::Instance_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmArgumentParser.h:229:28)>
           ::_M_invoke;
      local_518._0_8_ =
           std::
           _Function_handler<void_(ArgumentParser::Instance_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmArgumentParser.h:229:28)>
           ::_M_manager;
      name_02._M_str = "TARGETS";
      name_02._M_len = 7;
      ArgumentParser::Base::Bind((Base *)local_100,name_02,(KeywordAction *)&local_528);
      if ((_func_int **)local_518._0_8_ != (_func_int **)0x0) {
        (*(code *)local_518._0_8_)(&local_528,&local_528,3);
      }
      name_03.super_string_view._M_str = "ANDROID_MK";
      name_03.super_string_view._M_len = 10;
      cmArgumentParser<cmExportCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
      ::Bind<std::__cxx11::string>
                ((cmArgumentParser<cmExportCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                  *)local_100,name_03,0x80);
      name_04.super_string_view._M_str = "APPEND";
      name_04.super_string_view._M_len = 6;
      cmArgumentParser<Arguments>::Bind<bool>((cmArgumentParser<Arguments> *)local_100,name_04,0xc0)
      ;
      name_05.super_string_view._M_str = "EXPORT_LINK_INTERFACE_LIBRARIES";
      name_05.super_string_view._M_len = 0x1f;
      cmArgumentParser<Arguments>::Bind<bool>((cmArgumentParser<Arguments> *)local_100,name_05,0xc1)
      ;
    }
    local_518._0_8_ = local_2b8;
    local_2b8._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_2b8._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_2b8._16_8_ = (void *)0x0;
    local_298 = (undefined1  [8])(local_298 + 0x10);
    local_290 = (_Invoker_type)0x0;
    local_288._M_local_buf[0] = '\0';
    local_260 = false;
    local_258._M_p = (pointer)&local_248;
    local_250 = 0;
    local_248._M_local_buf[0] = '\0';
    local_238._0_8_ = local_238 + 0x10;
    local_238._8_8_ = (cmExportBuildFileGenerator *)0x0;
    local_228._M_local_buf[0] = '\0';
    local_218._M_p = (pointer)&local_208;
    local_210 = 0;
    local_208._M_local_buf[0] = '\0';
    local_1f8._M_p = (pointer)&local_1e8;
    local_1f0 = 0;
    local_1e8._M_local_buf[0] = '\0';
    local_1d8 = 0;
    local_528._8_8_ = (cmExportBuildFileGenerator *)0x0;
    local_518._8_8_ = local_298;
    local_508._0_8_ = 0;
    local_508._8_8_ = 0;
    local_508._16_8_ = 0;
    _Stack_4f0._M_p = (pointer)0x0;
    local_4e8._0_8_ = (_Base_ptr)0x0;
    local_4e8._8_8_ = (_Base_ptr)0x0;
    local_4e8._16_8_ = (pointer)0x0;
    auStack_4d0._0_8_ = (pointer)0x0;
    auStack_4d0._8_8_ = auStack_4d0._8_8_ & 0xffffffffffffff00;
    local_528._M_allocated_capacity = (size_type)(cmExportBuildFileGenerator *)local_100;
    ArgumentParser::Instance::
    Parse<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              ((Instance *)&local_528,args,0);
    if ((pointer)local_4e8._16_8_ != (pointer)0x0) {
      (*(code *)local_4e8._16_8_)(local_4e8,local_4e8,3);
    }
    if (local_2b8._0_8_ != local_2b8._8_8_) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5e0,
                     "Unknown argument: \"",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_2b8._0_8_);
      puVar10 = (undefined8 *)std::__cxx11::string::append(local_5e0);
      pcVar13 = (cmExportBuildFileGenerator *)(puVar10 + 2);
      if ((cmExportBuildFileGenerator *)*puVar10 == pcVar13) {
        local_518._0_8_ =
             (((vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
                *)&(pcVar13->super_cmExportFileGenerator)._vptr_cmExportFileGenerator)->
             super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
        local_518._8_8_ = puVar10[3];
        local_528._M_allocated_capacity = (size_type)(cmExportBuildFileGenerator *)local_518;
      }
      else {
        local_518._0_8_ =
             (((vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
                *)&(pcVar13->super_cmExportFileGenerator)._vptr_cmExportFileGenerator)->
             super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
        local_528._M_allocated_capacity = (size_type)(cmExportBuildFileGenerator *)*puVar10;
      }
      local_528._8_8_ = puVar10[1];
      *puVar10 = pcVar13;
      puVar10[1] = 0;
      *(undefined1 *)(puVar10 + 2) = 0;
      std::__cxx11::string::_M_assign((string *)&status->Error);
      if ((cmExportBuildFileGenerator *)local_528._M_allocated_capacity !=
          (cmExportBuildFileGenerator *)local_518) {
        operator_delete((void *)local_528._M_allocated_capacity,(ulong)(local_518._0_8_ + 1));
      }
      if ((cmExportBuildFileGenerator *)local_5e0._0_8_ != (cmExportBuildFileGenerator *)local_5d0)
      {
        operator_delete((void *)local_5e0._0_8_,CONCAT71(local_5d0._1_7_,local_5d0[0]) + 1);
      }
      bVar5 = false;
      goto LAB_00246335;
    }
    local_5b0._M_dataplus._M_p = local_5d0 + 0x30;
    local_5b0._M_string_length = 0;
    local_5b0.field_2._M_local_buf[0] = 0;
    local_2c0 = local_210;
    if (local_210 != 0) {
      std::__cxx11::string::_M_assign((string *)(local_5d0 + 0x20));
    }
    if ((cmExportBuildFileGenerator *)local_238._8_8_ == (cmExportBuildFileGenerator *)0x0) {
      if (local_5b0._M_string_length != 0) goto LAB_00245b2c;
      iVar7 = std::__cxx11::string::compare
                        ((char *)(args->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start);
      if (iVar7 == 0) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_528,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_298,".cmake");
        std::__cxx11::string::operator=
                  ((string *)(local_5d0 + 0x20),(string *)local_528._M_local_buf);
        if ((cmExportBuildFileGenerator *)local_528._M_allocated_capacity !=
            (cmExportBuildFileGenerator *)local_518) {
          operator_delete((void *)local_528._M_allocated_capacity,(ulong)(local_518._0_8_ + 1));
        }
        goto LAB_00245b2c;
      }
      local_528._M_allocated_capacity = (size_type)(cmExportBuildFileGenerator *)local_518;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_528,"FILE <filename> option missing.","");
      std::__cxx11::string::_M_assign((string *)&status->Error);
      if ((cmExportBuildFileGenerator *)local_528._M_allocated_capacity !=
          (cmExportBuildFileGenerator *)local_518) {
        operator_delete((void *)local_528._M_allocated_capacity,(ulong)(local_518._0_8_ + 1));
      }
LAB_00245c06:
      bVar5 = false;
    }
    else {
      if (local_5b0._M_string_length == 0) {
        cmsys::SystemTools::GetFilenameLastExtension((string *)&local_528,(string *)local_238);
        iVar7 = std::__cxx11::string::compare(local_528._M_local_buf);
        if ((cmExportBuildFileGenerator *)local_528._M_allocated_capacity !=
            (cmExportBuildFileGenerator *)local_518) {
          operator_delete((void *)local_528._M_allocated_capacity,(ulong)(local_518._0_8_ + 1));
        }
        if (iVar7 == 0) {
          std::__cxx11::string::_M_assign((string *)(local_5d0 + 0x20));
          goto LAB_00245b2c;
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_528._M_local_buf);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_528,"FILE option given filename \"",0x1c);
        poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_528,(char *)local_238._0_8_,local_238._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar11,"\" which does not have an extension of \".cmake\".\n",0x30);
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::_M_assign((string *)&status->Error);
LAB_00245bca:
        if ((cmExportBuildFileGenerator *)local_5e0._0_8_ != (cmExportBuildFileGenerator *)local_5d0
           ) {
          operator_delete((void *)local_5e0._0_8_,CONCAT71(local_5d0._1_7_,local_5d0[0]) + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_528._M_local_buf);
        std::ios_base::~ios_base((ios_base *)(auStack_4c0 + 8));
        goto LAB_00245c06;
      }
LAB_00245b2c:
      pcVar2 = status->Makefile;
      bVar5 = cmsys::SystemTools::FileIsFullPath((string *)(local_5d0 + 0x20));
      if (bVar5) {
        bVar5 = cmMakefile::CanIWriteThisFile(pcVar2,(string *)(local_5d0 + 0x20));
        if (!bVar5) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_528._M_local_buf);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_528,"FILE option given filename \"",0x1c);
          poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_528,local_5b0._M_dataplus._M_p,
                               local_5b0._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar11,"\" which is in the source tree.\n",0x1f);
          std::__cxx11::stringbuf::str();
          std::__cxx11::string::_M_assign((string *)&status->Error);
          goto LAB_00245bca;
        }
      }
      else {
        psVar12 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(pcVar2);
        pcVar3 = (psVar12->_M_dataplus)._M_p;
        local_5e0._0_8_ = (cmExportBuildFileGenerator *)local_5d0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_5e0,pcVar3,pcVar3 + psVar12->_M_string_length);
        std::__cxx11::string::append(local_5e0);
        puVar10 = (undefined8 *)
                  std::__cxx11::string::_M_append(local_5e0,(ulong)local_5b0._M_dataplus._M_p);
        pcVar13 = (cmExportBuildFileGenerator *)(puVar10 + 2);
        if ((cmExportBuildFileGenerator *)*puVar10 == pcVar13) {
          local_518._0_8_ =
               (((vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
                  *)&(pcVar13->super_cmExportFileGenerator)._vptr_cmExportFileGenerator)->
               super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
          local_518._8_8_ = puVar10[3];
          local_528._M_allocated_capacity = (size_type)(cmExportBuildFileGenerator *)local_518;
        }
        else {
          local_518._0_8_ =
               (((vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
                  *)&(pcVar13->super_cmExportFileGenerator)._vptr_cmExportFileGenerator)->
               super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
          local_528._M_allocated_capacity = (size_type)(cmExportBuildFileGenerator *)*puVar10;
        }
        local_528._8_8_ = puVar10[1];
        *puVar10 = pcVar13;
        puVar10[1] = 0;
        *(undefined1 *)(puVar10 + 2) = 0;
        std::__cxx11::string::operator=
                  ((string *)(local_5d0 + 0x20),(string *)local_528._M_local_buf);
        if ((cmExportBuildFileGenerator *)local_528._M_allocated_capacity !=
            (cmExportBuildFileGenerator *)local_518) {
          operator_delete((void *)local_528._M_allocated_capacity,(ulong)(local_518._0_8_ + 1));
        }
        if ((cmExportBuildFileGenerator *)local_5e0._0_8_ != (cmExportBuildFileGenerator *)local_5d0
           ) {
          operator_delete((void *)local_5e0._0_8_,CONCAT71(local_5d0._1_7_,local_5d0[0]) + 1);
        }
      }
      local_558._16_8_ = (pointer)0x0;
      auStack_540._0_8_ = (pointer)0x0;
      auStack_540._8_8_ = 0;
      this = cmMakefile::GetGlobalGenerator(pcVar2);
      iVar7 = std::__cxx11::string::compare
                        ((char *)(args->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start);
      if (iVar7 == 0) {
        iVar14 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet>_>_>
                 ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet>_>_>
                         *)&this->ExportSets,(key_type *)local_298);
        if ((_Rb_tree_header *)iVar14._M_node ==
            &(this->ExportSets).
             super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet>_>_>
             ._M_t._M_impl.super__Rb_tree_header) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_528._M_local_buf);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_528,"Export set \"",0xc);
          poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_528,(char *)local_298,(long)local_290);
          std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\" not found.",0xc);
          std::__cxx11::stringbuf::str();
          std::__cxx11::string::_M_assign((string *)&status->Error);
LAB_002462ce:
          if ((cmExportBuildFileGenerator *)local_5e0._0_8_ !=
              (cmExportBuildFileGenerator *)local_5d0) {
            operator_delete((void *)local_5e0._0_8_,CONCAT71(local_5d0._1_7_,local_5d0[0]) + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_528._M_local_buf);
          std::ios_base::~ios_base((ios_base *)(auStack_4c0 + 8));
          goto LAB_0024630a;
        }
        exportSet = (cmExportSet *)(iVar14._M_node + 2);
LAB_00245f11:
        pcVar13 = cmGlobalGenerator::GetExportedTargetsFile(this,(string *)(local_5d0 + 0x20));
        if ((pcVar13 != (cmExportBuildFileGenerator *)0x0) &&
           (PVar9 = cmMakefile::GetPolicyStatus(pcVar2,CMP0103,false), PVar9 != OLD)) {
          if (PVar9 != WARN) {
            local_528._M_allocated_capacity = 0x29;
            local_528._8_8_ = (long)"export() command already specified for the file\n  " + 9;
            local_5e0._0_8_ = local_238._8_8_;
            local_5e0._8_8_ = local_238._0_8_;
            cmStrCat<char[32]>((string *)local_590,(cmAlphaNum *)&local_528,(cmAlphaNum *)local_5e0,
                               (char (*) [32])"\nDid you miss \'APPEND\' keyword?");
            std::__cxx11::string::_M_assign((string *)&status->Error);
            if ((cmExportBuildFileGenerator *)local_590._0_8_ !=
                (cmExportBuildFileGenerator *)local_580) {
              ppVar16 = (pointer)CONCAT71(local_580._1_7_,local_580[0]);
              goto LAB_00245e82;
            }
            goto LAB_0024630a;
          }
          cmPolicies::GetPolicyWarning_abi_cxx11_
                    ((string *)(local_580 + 0x18),(cmPolicies *)0x67,id);
          local_528._M_allocated_capacity = local_580._32_8_;
          local_528._8_8_ = local_580._24_8_;
          local_5e0._8_8_ = local_5d0;
          local_5e0._0_8_ = (cmExportBuildFileGenerator *)0x1;
          local_5d0[0] = '\n';
          cmStrCat<char[51],std::__cxx11::string,char[32]>
                    ((string *)local_590,(cmAlphaNum *)&local_528,(cmAlphaNum *)local_5e0,
                     (char (*) [51])"export() command already specified for the file\n  ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_238,
                     (char (*) [32])"\nDid you miss \'APPEND\' keyword?");
          cmMakefile::IssueMessage(pcVar2,AUTHOR_WARNING,(string *)local_590);
          if ((cmExportBuildFileGenerator *)local_590._0_8_ !=
              (cmExportBuildFileGenerator *)local_580) {
            operator_delete((void *)local_590._0_8_,CONCAT71(local_580._1_7_,local_580[0]) + 1);
          }
          if ((cmExportBuildFileGenerator *)local_580._24_8_ !=
              (cmExportBuildFileGenerator *)local_558) {
            operator_delete((void *)local_580._24_8_,local_558._0_8_ + 1);
          }
        }
        if (local_2c0 == 0) {
          std::make_unique<cmExportBuildFileGenerator>();
        }
        else {
          std::make_unique<cmExportBuildAndroidMKGenerator>();
        }
        uVar17 = local_528._M_allocated_capacity;
        cmExportFileGenerator::SetExportFile
                  ((cmExportFileGenerator *)local_528._M_allocated_capacity,
                   local_5b0._M_dataplus._M_p);
        std::__cxx11::string::_M_assign((string *)(uVar17 + 8));
        local_120[0] = local_110;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_120,local_1f8._M_p,local_1f8._M_p + local_1f0);
        std::__cxx11::string::operator=((string *)(uVar17 + 0x158),(string *)local_120);
        if (local_120[0] != local_110) {
          operator_delete(local_120[0],local_110[0] + 1);
        }
        *(bool *)(uVar17 + 200) = local_1d8._0_1_;
        if (exportSet == (cmExportSet *)0x0) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)(uVar17 + 0x118),
                      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)(local_558 + 0x10));
        }
        else {
          cmExportBuildFileGenerator::SetExportSet((cmExportBuildFileGenerator *)uVar17,exportSet);
        }
        *(bool *)(uVar17 + 0x28) = local_1d8._1_1_;
        cmMakefile::GetGeneratorConfigs_abi_cxx11_
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_528,pcVar2,IncludeEmptyConfig);
        uVar4 = local_528._8_8_;
        for (config = local_528._M_allocated_capacity; config != uVar4;
            config = (long)&(((cmExportBuildFileGenerator *)config)->super_cmExportFileGenerator).
                            Namespace.field_2 + 8) {
          cmExportFileGenerator::AddConfiguration((cmExportFileGenerator *)uVar17,(string *)config);
        }
        if (exportSet == (cmExportSet *)0x0) {
          cmGlobalGenerator::AddBuildExportSet(this,(cmExportBuildFileGenerator *)uVar17);
        }
        else {
          cmGlobalGenerator::AddBuildExportExportSet(this,(cmExportBuildFileGenerator *)uVar17);
        }
        local_580._16_8_ = uVar17;
        cmMakefile::AddExportBuildFileGenerator
                  (pcVar2,(unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>
                           *)(local_580 + 0x10));
        if ((cmExportBuildFileGenerator *)local_580._16_8_ != (cmExportBuildFileGenerator *)0x0) {
          (**(code **)(*(long *)local_580._16_8_ + 8))();
        }
        local_580._16_8_ = 0;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_528);
        bVar5 = true;
      }
      else if (local_260 == true) {
        if (local_278._M_value.
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_278._M_value.
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          uVar17 = local_278._M_value.
                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          do {
            bVar5 = cmMakefile::IsAlias(pcVar2,(string *)uVar17);
            if (bVar5) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_528._M_local_buf);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_528,"given ALIAS target \"",0x14);
              poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&local_528,(((string *)uVar17)->_M_dataplus)._M_p,
                                   ((string *)uVar17)->_M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar11,"\" which may not be exported.",0x1c);
              std::__cxx11::stringbuf::str();
              std::__cxx11::string::_M_assign((string *)&status->Error);
              goto LAB_002462ce;
            }
            this_00 = cmGlobalGenerator::FindTarget(this,(string *)uVar17,false);
            if (this_00 == (cmTarget *)0x0) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_528._M_local_buf);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_528,"given target \"",0xe);
              poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&local_528,(((string *)uVar17)->_M_dataplus)._M_p,
                                   ((string *)uVar17)->_M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar11,"\" which is not built by this project.",0x25);
              std::__cxx11::stringbuf::str();
              std::__cxx11::string::_M_assign((string *)&status->Error);
              goto LAB_002462ce;
            }
            TVar8 = cmTarget::GetType(this_00);
            if (TVar8 == UTILITY) {
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_5e0,"given custom target \"",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             uVar17);
              puVar10 = (undefined8 *)std::__cxx11::string::append(local_5e0);
              pcVar13 = (cmExportBuildFileGenerator *)(puVar10 + 2);
              if ((cmExportBuildFileGenerator *)*puVar10 == pcVar13) {
                local_518._0_8_ =
                     (((vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
                        *)&(pcVar13->super_cmExportFileGenerator)._vptr_cmExportFileGenerator)->
                     super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
                local_518._8_8_ = puVar10[3];
                local_528._M_allocated_capacity = (size_type)(cmExportBuildFileGenerator *)local_518
                ;
              }
              else {
                local_518._0_8_ =
                     (((vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
                        *)&(pcVar13->super_cmExportFileGenerator)._vptr_cmExportFileGenerator)->
                     super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
                local_528._M_allocated_capacity = (size_type)(cmExportBuildFileGenerator *)*puVar10;
              }
              local_528._8_8_ = puVar10[1];
              *puVar10 = pcVar13;
              puVar10[1] = 0;
              *(undefined1 *)(puVar10 + 2) = 0;
              std::__cxx11::string::_M_assign((string *)&status->Error);
              if ((cmExportBuildFileGenerator *)local_528._M_allocated_capacity !=
                  (cmExportBuildFileGenerator *)local_518) {
                operator_delete((void *)local_528._M_allocated_capacity,(ulong)(local_518._0_8_ + 1)
                               );
              }
              if ((cmExportBuildFileGenerator *)local_5e0._0_8_ ==
                  (cmExportBuildFileGenerator *)local_5d0) goto LAB_0024630a;
              ppVar16 = (pointer)CONCAT71(local_5d0._1_7_,local_5d0[0]);
              local_590._0_8_ = local_5e0._0_8_;
              goto LAB_00245e82;
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)(local_558 + 0x10),(value_type *)uVar17);
            uVar17 = uVar17 + 0x20;
          } while ((pointer)uVar17 !=
                   local_278._M_value.
                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
        }
        if ((local_1d8._0_1_ != true) ||
           (pcVar13 = cmGlobalGenerator::GetExportedTargetsFile(this,(string *)(local_5d0 + 0x20)),
           pcVar13 == (cmExportBuildFileGenerator *)0x0)) {
          exportSet = (cmExportSet *)0x0;
          goto LAB_00245f11;
        }
        bVar5 = true;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &pcVar13->Targets,
                   (pcVar13->Targets).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,local_558._16_8_,auStack_540._0_8_);
      }
      else {
        local_528._M_allocated_capacity = (size_type)(cmExportBuildFileGenerator *)local_518;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_528,"EXPORT or TARGETS specifier missing.","");
        std::__cxx11::string::_M_assign((string *)&status->Error);
        ppVar16 = (pointer)local_518._0_8_;
        local_590._0_8_ = local_528._M_allocated_capacity;
        if ((cmExportBuildFileGenerator *)local_528._M_allocated_capacity !=
            (cmExportBuildFileGenerator *)local_518) {
LAB_00245e82:
          operator_delete((void *)local_590._0_8_,(ulong)((long)&(ppVar16->first)._M_len + 1));
        }
LAB_0024630a:
        bVar5 = false;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_558 + 0x10));
    }
    if (local_5b0._M_dataplus._M_p != local_5d0 + 0x30) {
      operator_delete(local_5b0._M_dataplus._M_p,
                      CONCAT71(local_5b0.field_2._M_allocated_capacity._1_7_,
                               local_5b0.field_2._M_local_buf[0]) + 1);
    }
LAB_00246335:
    cmExportCommand::Arguments::~Arguments((Arguments *)local_298);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_2b8);
    std::
    vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
    ::~vector(local_a8);
    if ((code *)local_b8._M_p != (code *)0x0) {
      (*(code *)local_b8._M_p)(local_c8,local_c8,3);
    }
    if ((_Manager_type)local_100._40_8_ != (_Manager_type)0x0) {
      (*(code *)local_100._40_8_)
                ((_Any_data *)(local_100 + 0x18),(_Any_data *)(local_100 + 0x18),__destroy_functor);
    }
    std::
    vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
    ::~vector((vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
               *)local_100);
    return bVar5;
  }
  local_590._8_8_ = (pointer)0x0;
  local_580[0] = '\0';
  local_590._0_8_ = (pointer)local_580;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
             (long)(args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start) < 0x21) {
LAB_0024561d:
    local_298 = (undefined1  [8])0x25;
    local_528._M_allocated_capacity = (size_type)local_518;
    local_528._M_allocated_capacity =
         std::__cxx11::string::_M_create(&local_528._M_allocated_capacity,(ulong)local_298);
    local_518._0_8_ = local_298;
    builtin_strncpy((char *)local_528._M_allocated_capacity,"PACKAGE must be given a package name.",
                    0x25);
    local_528._8_8_ = local_298;
    *(undefined1 *)((long)local_298 + local_528._M_allocated_capacity) = 0;
    std::__cxx11::string::_M_assign((string *)&status->Error);
    if ((undefined1 *)local_528._M_allocated_capacity != local_518) {
      operator_delete((void *)local_528._M_allocated_capacity,(ulong)(local_518._0_8_ + 1));
    }
  }
  else {
    std::__cxx11::string::_M_assign((string *)local_590);
    if ((ulong)((long)(args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
               (long)(args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start) < 0x41) {
      if ((pointer)local_590._8_8_ != (pointer)0x0) {
        local_50 = (char *)0x0;
        local_40 = (void *)0x0;
        local_38 = 0;
        memset((RegularExpression *)local_100,0,0xaa);
        cmsys::RegularExpression::compile((RegularExpression *)local_100,"^[A-Za-z0-9_.-]+$");
        bVar5 = cmsys::RegularExpression::find
                          ((RegularExpression *)local_100,(char *)local_590._0_8_,
                           (RegularExpressionMatch *)local_100);
        if (bVar5) {
          pcVar2 = status->Makefile;
          PVar9 = cmMakefile::GetPolicyStatus(pcVar2,CMP0090,false);
          if (PVar9 - NEW < 3) {
            local_528._M_allocated_capacity = (size_type)local_518;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_528,"CMAKE_EXPORT_PACKAGE_REGISTRY","");
            bVar6 = cmMakefile::IsOn(pcVar2,(string *)&local_528);
            if ((undefined1 *)local_528._M_allocated_capacity != local_518) {
              operator_delete((void *)local_528._M_allocated_capacity,(ulong)(local_518._0_8_ + 1));
            }
            if (!bVar6) goto LAB_0024650d;
          }
          else if (PVar9 < NEW) {
            local_528._M_allocated_capacity = (size_type)local_518;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_528,"CMAKE_EXPORT_NO_PACKAGE_REGISTRY","");
            bVar6 = cmMakefile::IsOn(pcVar2,(string *)&local_528);
            if ((undefined1 *)local_528._M_allocated_capacity != local_518) {
              operator_delete((void *)local_528._M_allocated_capacity,(ulong)(local_518._0_8_ + 1));
            }
            if (bVar6) goto LAB_0024650d;
          }
          psVar12 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(pcVar2);
          cmSystemTools::ComputeStringMD5((string *)(local_580 + 0x18),psVar12);
          __s = (psVar12->_M_dataplus)._M_p;
          local_5e0._8_8_ = (char *)0x0;
          local_5d0[0] = '\0';
          local_5e0._0_8_ = (cmExportBuildFileGenerator *)local_5d0;
          bVar6 = cmsys::SystemTools::GetEnv("HOME",(string *)local_5e0);
          if (bVar6) {
            cmsys::SystemTools::ConvertToUnixSlashes((string *)local_5e0);
            std::__cxx11::string::append(local_5e0);
            std::__cxx11::string::_M_append(local_5e0,local_590._0_8_);
            cmsys::SystemTools::MakeDirectory((string *)local_5e0,(mode_t *)0x0);
            std::__cxx11::string::append(local_5e0);
            std::__cxx11::string::append(local_5e0);
            bVar6 = cmsys::SystemTools::FileExists((string *)local_5e0);
            if (!bVar6) {
              cmGeneratedFileStream::cmGeneratedFileStream
                        ((cmGeneratedFileStream *)&local_528,(string *)local_5e0,true,None);
              if ((*(uint *)(local_508 + *(long *)(local_528._M_allocated_capacity - 0x18)) & 5) ==
                  0) {
                if (__s == (char *)0x0) {
                  std::ios::clear((int)auStack_5e8 +
                                  (int)*(long *)(local_528._M_allocated_capacity - 0x18) + 0xc0);
                }
                else {
                  sVar15 = strlen(__s);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_528,__s,sVar15);
                }
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_528,"\n",1);
              }
              else {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_298);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_298,"Cannot create package registry file:\n",0x25);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_298,"  ",2);
                poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_298,(char *)local_5e0._0_8_,local_5e0._8_8_);
                std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
                cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
                poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar11,local_5b0._M_dataplus._M_p,local_5b0._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
                if (local_5b0._M_dataplus._M_p != local_5d0 + 0x30) {
                  operator_delete(local_5b0._M_dataplus._M_p,
                                  CONCAT71(local_5b0.field_2._M_allocated_capacity._1_7_,
                                           local_5b0.field_2._M_local_buf[0]) + 1);
                }
                std::__cxx11::stringbuf::str();
                cmMakefile::IssueMessage(pcVar2,WARNING,(string *)(local_5d0 + 0x20));
                if (local_5b0._M_dataplus._M_p != local_5d0 + 0x30) {
                  operator_delete(local_5b0._M_dataplus._M_p,
                                  CONCAT71(local_5b0.field_2._M_allocated_capacity._1_7_,
                                           local_5b0.field_2._M_local_buf[0]) + 1);
                }
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_298);
                std::ios_base::~ios_base((ios_base *)(local_238 + 0x10));
              }
              cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)&local_528);
            }
          }
          if ((cmExportBuildFileGenerator *)local_5e0._0_8_ !=
              (cmExportBuildFileGenerator *)local_5d0) {
            operator_delete((void *)local_5e0._0_8_,CONCAT71(local_5d0._1_7_,local_5d0[0]) + 1);
          }
          if ((cmExportBuildFileGenerator *)local_580._24_8_ !=
              (cmExportBuildFileGenerator *)local_558) {
            operator_delete((void *)local_580._24_8_,local_558._0_8_ + 1);
          }
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_528._M_local_buf);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_528,"PACKAGE given invalid package name \"",0x24);
          poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_528,(char *)local_590._0_8_,local_590._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\".  ",4);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar11,"Package names must match \"",0x1a);
          std::__ostream_insert<char,std::char_traits<char>>(poVar11,"^[A-Za-z0-9_.-]+$",0x11);
          std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\".",2);
          std::__cxx11::stringbuf::str();
          std::__cxx11::string::_M_assign((string *)&status->Error);
          if (local_298 != (undefined1  [8])(local_298 + 0x10)) {
            operator_delete((void *)local_298,
                            CONCAT71(local_288._M_allocated_capacity._1_7_,local_288._M_local_buf[0]
                                    ) + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_528._M_local_buf);
          std::ios_base::~ios_base((ios_base *)(auStack_4c0 + 8));
        }
LAB_0024650d:
        if ((void *)local_40 != (void *)0x0) {
          operator_delete__((void *)local_40);
        }
        goto LAB_002456b4;
      }
      goto LAB_0024561d;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_528._M_local_buf);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_528,"PACKAGE given unknown argument: ",0x20);
    pbVar1 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_528,pbVar1[2]._M_dataplus._M_p,pbVar1[2]._M_string_length);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::_M_assign((string *)&status->Error);
    if (local_298 != (undefined1  [8])(local_298 + 0x10)) {
      operator_delete((void *)local_298,
                      CONCAT71(local_288._M_allocated_capacity._1_7_,local_288._M_local_buf[0]) + 1)
      ;
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_528._M_local_buf);
    std::ios_base::~ios_base((ios_base *)(auStack_4c0 + 8));
  }
  bVar5 = false;
LAB_002456b4:
  if ((pointer)local_590._0_8_ != (pointer)local_580) {
    operator_delete((void *)local_590._0_8_,CONCAT71(local_580._1_7_,local_580[0]) + 1);
  }
  return bVar5;
}

Assistant:

bool cmExportCommand(std::vector<std::string> const& args,
                     cmExecutionStatus& status)
{
  if (args.size() < 2) {
    status.SetError("called with too few arguments");
    return false;
  }

  if (args[0] == "PACKAGE") {
    return HandlePackage(args, status);
  }

  struct Arguments
  {
    std::string ExportSetName;
    cm::optional<ArgumentParser::MaybeEmpty<std::vector<std::string>>> Targets;
    std::string Namespace;
    std::string Filename;
    std::string AndroidMKFile;
    std::string CxxModulesDirectory;
    bool Append = false;
    bool ExportOld = false;
  };

  auto parser = cmArgumentParser<Arguments>{}
                  .Bind("NAMESPACE"_s, &Arguments::Namespace)
                  .Bind("FILE"_s, &Arguments::Filename);

  bool const supportCxx20FileSetTypes = cmExperimental::HasSupportEnabled(
    status.GetMakefile(), cmExperimental::Feature::CxxModuleCMakeApi);
  if (supportCxx20FileSetTypes) {
    parser.Bind("CXX_MODULES_DIRECTORY"_s, &Arguments::CxxModulesDirectory);
  }

  if (args[0] == "EXPORT") {
    parser.Bind("EXPORT"_s, &Arguments::ExportSetName);
  } else {
    parser.Bind("TARGETS"_s, &Arguments::Targets);
    parser.Bind("ANDROID_MK"_s, &Arguments::AndroidMKFile);
    parser.Bind("APPEND"_s, &Arguments::Append);
    parser.Bind("EXPORT_LINK_INTERFACE_LIBRARIES"_s, &Arguments::ExportOld);
  }

  std::vector<std::string> unknownArgs;
  Arguments const arguments = parser.Parse(args, &unknownArgs);

  if (!unknownArgs.empty()) {
    status.SetError("Unknown argument: \"" + unknownArgs.front() + "\".");
    return false;
  }

  std::string fname;
  bool android = false;
  if (!arguments.AndroidMKFile.empty()) {
    fname = arguments.AndroidMKFile;
    android = true;
  }
  if (arguments.Filename.empty() && fname.empty()) {
    if (args[0] != "EXPORT") {
      status.SetError("FILE <filename> option missing.");
      return false;
    }
    fname = arguments.ExportSetName + ".cmake";
  } else if (fname.empty()) {
    // Make sure the file has a .cmake extension.
    if (cmSystemTools::GetFilenameLastExtension(arguments.Filename) !=
        ".cmake") {
      std::ostringstream e;
      e << "FILE option given filename \"" << arguments.Filename
        << "\" which does not have an extension of \".cmake\".\n";
      status.SetError(e.str());
      return false;
    }
    fname = arguments.Filename;
  }

  cmMakefile& mf = status.GetMakefile();

  // Get the file to write.
  if (cmSystemTools::FileIsFullPath(fname)) {
    if (!mf.CanIWriteThisFile(fname)) {
      std::ostringstream e;
      e << "FILE option given filename \"" << fname
        << "\" which is in the source tree.\n";
      status.SetError(e.str());
      return false;
    }
  } else {
    // Interpret relative paths with respect to the current build dir.
    std::string const& dir = mf.GetCurrentBinaryDirectory();
    fname = dir + "/" + fname;
  }

  std::vector<std::string> targets;

  cmGlobalGenerator* gg = mf.GetGlobalGenerator();

  cmExportSet* exportSet = nullptr;
  if (args[0] == "EXPORT") {
    cmExportSetMap& setMap = gg->GetExportSets();
    auto const it = setMap.find(arguments.ExportSetName);
    if (it == setMap.end()) {
      std::ostringstream e;
      e << "Export set \"" << arguments.ExportSetName << "\" not found.";
      status.SetError(e.str());
      return false;
    }
    exportSet = &it->second;
  } else if (arguments.Targets) {
    for (std::string const& currentTarget : *arguments.Targets) {
      if (mf.IsAlias(currentTarget)) {
        std::ostringstream e;
        e << "given ALIAS target \"" << currentTarget
          << "\" which may not be exported.";
        status.SetError(e.str());
        return false;
      }

      if (cmTarget* target = gg->FindTarget(currentTarget)) {
        if (target->GetType() == cmStateEnums::UTILITY) {
          status.SetError("given custom target \"" + currentTarget +
                          "\" which may not be exported.");
          return false;
        }
      } else {
        std::ostringstream e;
        e << "given target \"" << currentTarget
          << "\" which is not built by this project.";
        status.SetError(e.str());
        return false;
      }
      targets.push_back(currentTarget);
    }
    if (arguments.Append) {
      if (cmExportBuildFileGenerator* ebfg =
            gg->GetExportedTargetsFile(fname)) {
        ebfg->AppendTargets(targets);
        return true;
      }
    }
  } else {
    status.SetError("EXPORT or TARGETS specifier missing.");
    return false;
  }

  // if cmExportBuildFileGenerator is already defined for the file
  // and APPEND is not specified, if CMP0103 is OLD ignore previous definition
  // else raise an error
  if (gg->GetExportedTargetsFile(fname) != nullptr) {
    switch (mf.GetPolicyStatus(cmPolicies::CMP0103)) {
      case cmPolicies::WARN:
        mf.IssueMessage(
          MessageType::AUTHOR_WARNING,
          cmStrCat(cmPolicies::GetPolicyWarning(cmPolicies::CMP0103), '\n',
                   "export() command already specified for the file\n  ",
                   arguments.Filename, "\nDid you miss 'APPEND' keyword?"));
        CM_FALLTHROUGH;
      case cmPolicies::OLD:
        break;
      default:
        status.SetError(cmStrCat("command already specified for the file\n  ",
                                 arguments.Filename,
                                 "\nDid you miss 'APPEND' keyword?"));
        return false;
    }
  }

  // Setup export file generation.
  std::unique_ptr<cmExportBuildFileGenerator> ebfg = nullptr;
  if (android) {
    ebfg = cm::make_unique<cmExportBuildAndroidMKGenerator>();
  } else {
    ebfg = cm::make_unique<cmExportBuildFileGenerator>();
  }
  ebfg->SetExportFile(fname.c_str());
  ebfg->SetNamespace(arguments.Namespace);
  ebfg->SetCxxModuleDirectory(arguments.CxxModulesDirectory);
  ebfg->SetAppendMode(arguments.Append);
  if (exportSet != nullptr) {
    ebfg->SetExportSet(exportSet);
  } else {
    ebfg->SetTargets(targets);
  }
  ebfg->SetExportOld(arguments.ExportOld);

  // Compute the set of configurations exported.
  std::vector<std::string> configurationTypes =
    mf.GetGeneratorConfigs(cmMakefile::IncludeEmptyConfig);

  for (std::string const& ct : configurationTypes) {
    ebfg->AddConfiguration(ct);
  }
  if (exportSet != nullptr) {
    gg->AddBuildExportExportSet(ebfg.get());
  } else {
    gg->AddBuildExportSet(ebfg.get());
  }
  mf.AddExportBuildFileGenerator(std::move(ebfg));

  return true;
}